

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_formatting.cpp
# Opt level: O2

void test_manip<wchar_t>(string *e_charset)

{
  int iVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbVar2;
  wostringstream *pwVar3;
  char *pcVar4;
  double dVar5;
  __type _Var6;
  bool bVar7;
  ostream *poVar8;
  wistream *pwVar9;
  wostream *pwVar10;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar11;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar12;
  time_t tVar13;
  tm *__tp;
  long lVar14;
  runtime_error *prVar15;
  string *e;
  uint uVar16;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1280;
  allocator local_1260 [8];
  string marks;
  locale local_1238 [8];
  locale local_1230 [8];
  locale local_1228 [8];
  locale local_1220 [8];
  locale local_1218 [8];
  locale local_1210 [8];
  locale local_1208 [8];
  locale local_1200 [8];
  locale local_11f8 [8];
  locale local_11f0 [8];
  locale local_11e8 [8];
  locale local_11e0 [8];
  locale local_11d8 [8];
  locale local_11d0 [8];
  locale local_11c8 [8];
  locale local_11c0 [8];
  locale local_11b8 [8];
  locale local_11b0 [8];
  locale local_11a8 [8];
  locale local_11a0 [8];
  locale local_1198 [8];
  locale local_1190 [8];
  locale local_1188 [8];
  locale local_1180 [8];
  locale local_1178 [8];
  locale local_1170 [8];
  locale local_1168 [8];
  locale local_1160 [8];
  locale local_1158 [8];
  locale local_1150 [8];
  locale local_1148 [8];
  locale local_1140 [8];
  locale local_1138 [8];
  locale local_1130 [8];
  locale local_1128 [8];
  locale local_1120 [8];
  locale local_1118 [8];
  locale local_1110 [8];
  locale local_1108 [8];
  locale local_1100 [8];
  locale local_10f8 [8];
  locale local_10f0 [8];
  locale local_10e8 [8];
  locale local_10e0 [8];
  locale local_10d8 [8];
  locale local_10d0 [8];
  locale local_10c8 [8];
  locale local_10c0 [8];
  locale local_10b8 [8];
  locale local_10b0 [8];
  locale local_10a8 [8];
  locale local_10a0 [8];
  locale local_1098 [8];
  locale local_1090 [8];
  locale local_1088 [8];
  locale local_1080 [8];
  locale local_1078 [8];
  locale local_1070 [8];
  locale local_1068 [8];
  locale local_1060 [8];
  locale local_1058 [8];
  locale local_1050 [8];
  locale local_1048 [8];
  locale local_1040 [8];
  locale local_1038 [8];
  locale local_1030 [8];
  locale local_1028 [8];
  locale local_1020 [8];
  locale local_1018 [8];
  locale local_1010 [8];
  locale local_1008 [8];
  locale local_1000 [8];
  locale local_ff8 [8];
  locale local_ff0 [8];
  locale local_fe8 [8];
  locale local_fe0 [8];
  locale local_fd8 [8];
  locale local_fd0 [8];
  locale local_fc8 [8];
  locale local_fc0 [8];
  locale local_fb8 [8];
  locale local_fb0 [8];
  locale local_fa8 [8];
  locale local_fa0 [8];
  locale local_f98 [8];
  locale local_f90 [8];
  locale local_f88 [8];
  locale local_f80 [8];
  locale local_f78 [8];
  locale local_f70 [8];
  locale local_f68 [8];
  locale local_f60 [8];
  locale local_f58 [8];
  locale local_f50 [8];
  locale local_f48 [8];
  locale local_f40 [8];
  locale local_f38 [8];
  locale local_f30 [8];
  locale local_f28 [8];
  locale local_f20 [8];
  locale local_f18 [8];
  locale local_f10 [8];
  locale local_f08 [8];
  locale local_f00 [8];
  locale local_ef8 [8];
  locale local_ef0 [8];
  locale local_ee8 [8];
  locale local_ee0 [8];
  locale local_ed8 [8];
  locale local_ed0 [8];
  locale local_ec8 [8];
  locale local_ec0 [8];
  locale local_eb8 [8];
  locale local_eb0 [8];
  locale local_ea8 [8];
  locale local_ea0 [8];
  locale local_e98 [8];
  locale local_e90 [8];
  locale local_e88 [8];
  locale local_e80 [8];
  locale local_e78 [8];
  locale local_e70 [8];
  locale local_e68 [8];
  locale local_e60 [8];
  locale local_e58 [8];
  locale local_e50 [8];
  locale local_e48 [8];
  locale local_e40 [8];
  locale local_e38 [8];
  locale local_e30 [8];
  locale local_e28 [8];
  locale local_e20 [8];
  locale local_e18 [8];
  locale local_e10 [8];
  locale local_e08 [8];
  locale local_e00 [8];
  locale local_df8 [8];
  locale local_df0 [8];
  locale local_de8 [8];
  locale local_de0 [8];
  locale local_dd8 [8];
  locale local_dd0 [8];
  locale local_dc8 [8];
  locale local_dc0 [8];
  locale local_db8 [8];
  locale local_db0 [8];
  locale local_da8 [8];
  locale local_da0 [8];
  locale local_d98 [8];
  locale local_d90 [8];
  locale local_d88 [8];
  locale local_d80 [8];
  locale local_d78 [8];
  locale local_d70 [8];
  locale local_d68 [8];
  locale local_d60 [8];
  locale local_d58 [8];
  locale local_d50 [8];
  locale local_d48 [8];
  locale local_d40 [8];
  locale local_d38 [8];
  locale local_d30 [8];
  locale local_d28 [8];
  locale local_d20 [8];
  locale local_d18 [8];
  locale local_d10 [8];
  locale local_d08 [8];
  locale local_d00 [8];
  locale local_cf8 [8];
  locale local_cf0 [8];
  locale local_ce8 [8];
  locale local_ce0 [8];
  long local_cd8;
  time_t lnow;
  locale local_cc8 [8];
  locale local_cc0 [8];
  locale local_cb8 [8];
  locale local_cb0 [8];
  locale local_ca8 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_ca0;
  locale local_c80 [8];
  locale local_c78 [8];
  locale local_c70 [8];
  locale local_c68 [8];
  locale local_c60 [8];
  locale local_c58 [8];
  locale local_c50 [8];
  locale local_c48 [8];
  locale local_c40 [8];
  locale local_c38 [8];
  locale local_c30 [8];
  locale local_c28 [8];
  locale local_c20 [8];
  locale local_c18 [8];
  locale local_c10 [8];
  locale local_c08 [8];
  locale local_c00 [8];
  locale local_bf8 [8];
  locale local_bf0 [8];
  locale local_be8 [8];
  locale local_be0 [8];
  locale local_bd8 [8];
  locale local_bd0 [8];
  locale local_bc8 [8];
  locale local_bc0 [8];
  locale local_bb8 [8];
  locale local_bb0 [8];
  locale local_ba8 [8];
  locale local_ba0 [8];
  locale local_b98 [8];
  locale local_b90 [8];
  locale local_b88 [8];
  locale local_b80 [8];
  locale local_b78 [8];
  locale local_b70 [8];
  locale local_b68 [8];
  locale local_b60 [8];
  locale local_b58 [8];
  locale local_b50 [8];
  locale local_b48 [8];
  locale local_b40 [8];
  locale local_b38 [8];
  locale local_b30 [8];
  locale local_b28 [8];
  locale local_b20 [8];
  locale local_b18 [8];
  locale local_b10 [8];
  locale local_b08 [8];
  locale local_b00 [8];
  locale local_af8 [8];
  locale local_af0 [8];
  locale local_ae8 [8];
  locale local_ae0 [8];
  locale local_ad8 [8];
  locale local_ad0 [8];
  locale local_ac8 [8];
  locale local_ac0 [8];
  locale local_ab8 [8];
  locale local_ab0 [8];
  locale local_aa8 [8];
  locale local_aa0 [8];
  locale local_a98 [8];
  locale local_a90 [8];
  locale local_a88 [8];
  locale local_a80 [8];
  locale local_a78 [8];
  locale local_a70 [8];
  locale local_a68 [8];
  locale local_a60 [8];
  locale local_a58 [8];
  locale local_a50 [8];
  locale local_a48 [8];
  locale local_a40 [8];
  locale local_a38 [8];
  locale local_a30 [8];
  locale local_a28 [8];
  locale local_a20 [8];
  locale local_a18 [8];
  locale local_a10 [8];
  locale local_a08 [8];
  locale local_a00 [8];
  locale local_9f8 [8];
  locale local_9f0 [8];
  locale local_9e8 [8];
  locale local_9e0 [8];
  locale local_9d8 [8];
  locale local_9d0 [8];
  locale local_9c8 [8];
  locale local_9c0 [8];
  locale local_9b8 [8];
  locale local_9b0 [8];
  locale local_9a8 [8];
  locale local_9a0 [8];
  locale local_998 [8];
  locale local_990 [8];
  locale local_988 [8];
  locale local_980 [8];
  locale local_978 [8];
  locale local_970 [8];
  locale local_968 [8];
  locale local_960 [8];
  locale local_958 [8];
  locale local_950 [8];
  locale local_948 [8];
  locale local_940 [8];
  locale local_938 [8];
  locale local_930 [8];
  locale local_928 [8];
  locale local_920 [8];
  locale local_918 [8];
  locale local_910 [8];
  locale local_908 [8];
  locale local_900 [8];
  locale local_8f8 [8];
  locale local_8f0 [8];
  locale local_8e8 [8];
  locale local_8e0 [8];
  locale local_8d8 [8];
  locale local_8d0 [8];
  locale local_8c8 [8];
  locale local_8c0 [8];
  locale local_8b8 [8];
  locale local_8b0 [8];
  locale local_8a8 [8];
  locale local_8a0 [8];
  locale local_898 [8];
  locale local_890 [8];
  locale local_888 [8];
  locale local_880 [8];
  locale local_878 [8];
  locale local_870 [8];
  locale local_868 [8];
  locale local_860 [8];
  locale local_858 [8];
  locale local_850 [8];
  locale local_848 [8];
  locale local_840 [8];
  locale local_838 [8];
  locale local_830 [8];
  locale local_828 [8];
  locale local_820 [8];
  locale local_818 [8];
  locale local_810 [8];
  locale local_808 [8];
  locale local_800 [8];
  locale local_7f8 [8];
  locale local_7f0 [8];
  locale local_7e8 [8];
  locale local_7e0 [8];
  locale local_7d8 [8];
  locale local_7d0 [8];
  locale local_7c8 [8];
  locale local_7c0 [8];
  locale local_7b8 [8];
  locale local_7b0 [8];
  locale local_7a8 [8];
  locale local_7a0 [8];
  locale local_798 [8];
  locale local_790 [8];
  locale local_788 [8];
  locale local_780 [8];
  locale local_778 [8];
  long local_770;
  undefined1 local_768 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> format_string;
  generator g;
  allocator local_73c;
  allocator local_73b;
  allocator local_73a;
  allocator local_739;
  allocator local_738;
  allocator local_737;
  allocator local_736;
  allocator local_735;
  allocator local_734;
  allocator local_733;
  allocator local_732;
  allocator local_731;
  allocator local_730;
  allocator local_72f;
  allocator local_72e;
  allocator local_72d;
  allocator local_72c;
  allocator local_72b;
  allocator local_72a;
  allocator local_729;
  char *local_728;
  string format;
  string result [26];
  allocator local_3b9;
  undefined1 local_3b8 [8];
  string expected_f [4];
  char local_time_str [256];
  undefined1 local_230 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> act;
  undefined1 local_b8 [8];
  string sample_f [4];
  locale loc;
  
  booster::locale::generator::generator((generator *)((long)&format_string.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&format.field_2 + 8),"en_US.",e_charset);
  booster::locale::generator::generate((string *)(sample_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue((locale *)(marks.field_2._M_local_buf + 8));
  std::locale::~locale((locale *)(marks.field_2._M_local_buf + 8));
  booster::locale::as::posix
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<double>(1200.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"1200.1",(allocator *)local_3b8);
  std::locale::locale(local_c80,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_c80);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_c80);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe2);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"1200.1\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1238);
  std::locale::~locale(local_1238);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"1200.1",(allocator *)local_b8);
  std::locale::locale(local_c78,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_c78);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_c78);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::posix
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 1200.1) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe2);
    poVar8 = std::operator<<(poVar8," (v)==(1200.1)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe2);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1230);
  std::locale::~locale(local_1230);
  std::__cxx11::string::string((string *)local_b8,"1200.1",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_c70,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_c70);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_c70);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::posix
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 1200.1) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe2);
    poVar8 = std::operator<<(poVar8," (v)==(1200.1)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe2);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1228);
  std::locale::~locale(local_1228);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<double>(1200.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"1,200.1",(allocator *)local_3b8);
  std::locale::locale(local_c68,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_c68);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_c68);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe3);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"1,200.1\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1220);
  std::locale::~locale(local_1220);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"1,200.1",(allocator *)local_b8);
  std::locale::locale(local_c60,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_c60);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_c60);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 1200.1) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe3);
    poVar8 = std::operator<<(poVar8," (v)==(1200.1)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe3);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1218);
  std::locale::~locale(local_1218);
  std::__cxx11::string::string((string *)local_b8,"1,200.1",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_c58,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_c58);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_c58);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 1200.1) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe3);
    poVar8 = std::operator<<(poVar8," (v)==(1200.1)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe3);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1210);
  std::locale::~locale(local_1210);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  pwVar10 = std::operator<<((undefined1 *)((long)&format.field_2 + 8),0x5f);
  *(undefined8 *)(pwVar10 + *(long *)(*(long *)pwVar10 + -0x18) + 0x10) = 6;
  std::wostream::operator<<(pwVar10,0x5fe);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"_1,534",(allocator *)local_3b8);
  std::locale::locale(local_c50,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_c50);
  pbVar2 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           (&expected_f[3].field_2._M_allocated_capacity + 1);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_c50);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe4);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"_1,534\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1208);
  std::locale::~locale(local_1208);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xffffff4f |
       0x20;
  pwVar10 = std::operator<<((undefined1 *)((long)&format.field_2 + 8),0x5f);
  *(undefined8 *)(pwVar10 + *(long *)(*(long *)pwVar10 + -0x18) + 0x10) = 6;
  std::wostream::operator<<(pwVar10,0x5fe);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"1,534_",(allocator *)local_3b8);
  std::locale::locale(local_c48,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_c48);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_c48);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe5);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"1,534_\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1200);
  std::locale::~locale(local_1200);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::operator<<((wostream *)(format.field_2._M_local_buf + 8),-0x8000);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"-32,768",(allocator *)local_3b8);
  std::locale::locale(local_c40,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_c40);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_c40);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe9);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"-32,768\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_11f8);
  std::locale::~locale(local_11f8);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::operator<<((wostream *)(format.field_2._M_local_buf + 8),0x7fff);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"32,767",(allocator *)local_3b8);
  std::locale::locale(local_c38,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_c38);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_c38);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe9);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"32,767\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11f0);
  std::locale::~locale(local_11f0);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"-32,768",(allocator *)local_b8);
  std::locale::locale(local_c30,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_c30);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_c30);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>
                     ((wistream *)(format.field_2._M_local_buf + 8),(short *)local_3b8);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe9);
  poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<short>::min())");
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar1 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_230,"Error limits reached, stopping unit test",
               (allocator *)(expected_f[3].field_2._M_local_buf + 8));
    booster::runtime_error::runtime_error(prVar15,(string *)local_230);
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe9);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11e8);
  std::locale::~locale(local_11e8);
  std::__cxx11::string::string((string *)local_b8,"-32,768",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_c28,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_c28);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_c28);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>
                     ((wistream *)(format.field_2._M_local_buf + 8),(short *)local_3b8);
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe9);
  poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<short>::min())");
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar1 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_230,"Error limits reached, stopping unit test",(allocator *)local_b8)
    ;
    booster::runtime_error::runtime_error(prVar15,(string *)local_230);
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe9);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11e0);
  std::locale::~locale(local_11e0);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"32,767",(allocator *)local_b8);
  std::locale::locale(local_c20,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_c20);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_c20);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>
                     ((wistream *)(format.field_2._M_local_buf + 8),(short *)local_3b8);
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (local_3b8._0_2_ != 0x7fff) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe9);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<short>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe9);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11d8);
  std::locale::~locale(local_11d8);
  std::__cxx11::string::string((string *)local_b8,"32,767",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_c18,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_c18);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_c18);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>
                     ((wistream *)(format.field_2._M_local_buf + 8),(short *)local_3b8);
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (local_3b8._0_2_ != 0x7fff) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe9);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<short>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe9);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_11d0);
  std::locale::~locale(local_11d0);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"0",(allocator *)local_3b8);
  std::locale::locale(local_c10,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_c10);
  pbVar2 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           (expected_f[3].field_2._M_local_buf + 8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_c10);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xea);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"0\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_11c8);
  std::locale::~locale(local_11c8);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"65,535",(allocator *)local_3b8);
  std::locale::locale(local_c08,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_c08);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_c08);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xea);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"65,535\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11c0);
  std::locale::~locale(local_11c0);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"0",(allocator *)local_b8);
  std::locale::locale(local_c00,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_c00);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_c00);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<unsigned_short>((ushort *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (local_3b8._0_2_ != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xea);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<unsigned short>::min())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xea);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11b8);
  std::locale::~locale(local_11b8);
  std::__cxx11::string::string((string *)local_b8,"0",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_bf8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_bf8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_bf8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<unsigned_short>((ushort *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (local_3b8._0_2_ != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xea);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<unsigned short>::min())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xea);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11b0);
  std::locale::~locale(local_11b0);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"65,535",(allocator *)local_b8);
  std::locale::locale(local_bf0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_bf0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_bf0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<unsigned_short>((ushort *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (local_3b8._0_2_ != -1) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xea);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<unsigned short>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xea);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11a8);
  std::locale::~locale(local_11a8);
  std::__cxx11::string::string((string *)local_b8,"65,535",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_be8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_be8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_be8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<unsigned_short>((ushort *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (local_3b8._0_2_ != -1) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xea);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<unsigned short>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xea);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"-1",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_be0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_be0);
  std::locale::~locale(local_be0);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_11a0);
  std::locale::~locale(local_11a0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  std::wistream::_M_extract<unsigned_short>((ushort *)(format.field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xeb);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1198);
  std::locale::~locale(local_1198);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions
            ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
             (int)(format.field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)(format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18))
            );
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_short>((ushort *)(format.field_2._M_local_buf + 8));
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xeb);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Error limits reached, stopping unit test",(allocator *)local_3b8);
    booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  bVar7 = short_parsing_fails();
  if (bVar7) {
    std::__cxx11::string::string
              ((string *)(format.field_2._M_local_buf + 8),"65,535",
               (allocator *)(expected_f[3].field_2._M_local_buf + 8));
    std::locale::locale(local_bd8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&format.field_2 + 8),local_bd8);
    std::locale::~locale(local_bd8);
    std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_1190);
    std::locale::~locale(local_1190);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    booster::locale::as::number
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(short *)local_b8);
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xed);
      poVar8 = std::operator<<(poVar8," ss.fail()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)(expected_f[3].field_2._M_local_buf + 8),
                   "Error limits reached, stopping unit test",(allocator *)local_3b8);
        booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_1188);
    std::locale::~locale(local_1188);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::wios::exceptions
              ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
               (int)(format.field_2._M_local_buf + 8));
    booster::locale::as::number
              ((ios_base *)
               (format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18)));
    test_counter = test_counter + 1;
    std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(short *)local_b8);
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xed);
    poVar8 = std::operator<<(poVar8," ss >> v");
    std::endl<char,std::char_traits<char>>(poVar8);
    if (0x14 < error_counter) {
      error_counter = error_counter + 1;
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    error_counter = error_counter + 1;
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)local_230);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1180);
  std::locale::~locale(local_1180);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::operator<<((wostream *)(format.field_2._M_local_buf + 8),-0x80000000);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"-2,147,483,648",(allocator *)local_3b8);
  std::locale::locale(local_bd0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_bd0);
  pbVar2 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           (expected_f[3].field_2._M_local_buf + 8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_bd0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf1);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"-2,147,483,648\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1178);
  std::locale::~locale(local_1178);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::operator<<((wostream *)(format.field_2._M_local_buf + 8),0x7fffffff);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"2,147,483,647",(allocator *)local_3b8);
  std::locale::locale(local_bc8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_bc8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_bc8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf1);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"2,147,483,647\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1170);
  std::locale::~locale(local_1170);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"-2,147,483,648",
             (allocator *)local_b8);
  std::locale::locale(local_bc0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_bc0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_bc0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf1);
  poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<int>::min())");
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar1 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_230,"Error limits reached, stopping unit test",
               (allocator *)(expected_f[3].field_2._M_local_buf + 8));
    booster::runtime_error::runtime_error(prVar15,(string *)local_230);
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf1);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1168);
  std::locale::~locale(local_1168);
  std::__cxx11::string::string((string *)local_b8,"-2,147,483,648",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_bb8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_bb8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_bb8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf1);
  poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<int>::min())");
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar1 = error_counter + 1;
  if (0x14 < error_counter) {
    error_counter = iVar1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_230,"Error limits reached, stopping unit test",(allocator *)local_b8)
    ;
    booster::runtime_error::runtime_error(prVar15,(string *)local_230);
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = iVar1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf1);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1160);
  std::locale::~locale(local_1160);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"2,147,483,647",
             (allocator *)local_b8);
  std::locale::locale(local_bb0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_bb0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_bb0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0x7fffffff) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf1);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<int>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf1);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1158);
  std::locale::~locale(local_1158);
  std::__cxx11::string::string((string *)local_b8,"2,147,483,647",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_ba8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_ba8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_ba8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0x7fffffff) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf1);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<int>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf1);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1150);
  std::locale::~locale(local_1150);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"0",(allocator *)local_3b8);
  std::locale::locale(local_ba0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_ba0);
  pbVar2 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           (expected_f[3].field_2._M_local_buf + 8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_ba0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf2);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"0\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1148);
  std::locale::~locale(local_1148);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"4,294,967,295",(allocator *)local_3b8);
  std::locale::locale(local_b98,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_b98);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_b98);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf2);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"4,294,967,295\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1140);
  std::locale::~locale(local_1140);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"0",(allocator *)local_b8);
  std::locale::locale(local_b90,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b90);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_b90);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<unsigned_int>((uint *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf2);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<unsigned int>::min())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf2);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1138);
  std::locale::~locale(local_1138);
  std::__cxx11::string::string((string *)local_b8,"0",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_b88,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b88);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_b88);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<unsigned_int>((uint *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf2);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<unsigned int>::min())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf2);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1130);
  std::locale::~locale(local_1130);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"4,294,967,295",
             (allocator *)local_b8);
  std::locale::locale(local_b80,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b80);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_b80);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<unsigned_int>((uint *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != -1) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf2);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<unsigned int>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf2);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1128);
  std::locale::~locale(local_1128);
  std::__cxx11::string::string((string *)local_b8,"4,294,967,295",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_b78,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b78);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_b78);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<unsigned_int>((uint *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != -1) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf2);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<unsigned int>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf2);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"-1",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_b70,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_b70);
  std::locale::~locale(local_b70);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1120);
  std::locale::~locale(local_1120);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  std::wistream::_M_extract<unsigned_int>((uint *)(format.field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf3);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1118);
  std::locale::~locale(local_1118);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions
            ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
             (int)(format.field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)(format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18))
            );
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_int>((uint *)(format.field_2._M_local_buf + 8));
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf3);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Error limits reached, stopping unit test",(allocator *)local_3b8);
    booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"4,294,967,295",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_b68,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_b68);
  std::locale::~locale(local_b68);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1110);
  std::locale::~locale(local_1110);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_b8);
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf4);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1108);
  std::locale::~locale(local_1108);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions
            ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
             (int)(format.field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)(format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18))
            );
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_b8);
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xf4);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Error limits reached, stopping unit test",(allocator *)local_3b8);
    booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1100);
  std::locale::~locale(local_1100);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string
            ((string *)local_b8,"-9,223,372,036,854,775,808",(allocator *)local_3b8);
  std::locale::locale(local_b60,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_b60);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_b60);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfd);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"-9,223,372,036,854,775,808\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_10f8);
  std::locale::~locale(local_10f8);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string
            ((string *)local_b8,"9,223,372,036,854,775,807",(allocator *)local_3b8);
  std::locale::locale(local_b58,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_b58);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_b58);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfd);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"9,223,372,036,854,775,807\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10f0);
  std::locale::~locale(local_10f0);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"-9,223,372,036,854,775,808",
             (allocator *)local_b8);
  std::locale::locale(local_b50,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b50);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_b50);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != -0x8000000000000000) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfd);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<long>::min())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfd);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10e8);
  std::locale::~locale(local_10e8);
  std::__cxx11::string::string
            ((string *)local_b8,"-9,223,372,036,854,775,808",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_b48,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b48);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_b48);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != -0x8000000000000000) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfd);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<long>::min())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfd);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10e0);
  std::locale::~locale(local_10e0);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"9,223,372,036,854,775,807",
             (allocator *)local_b8);
  std::locale::locale(local_b40,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b40);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_b40);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x7fffffffffffffff) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfd);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<long>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfd);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10d8);
  std::locale::~locale(local_10d8);
  std::__cxx11::string::string
            ((string *)local_b8,"9,223,372,036,854,775,807",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_b38,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b38);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_b38);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x7fffffffffffffff) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfd);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<long>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfd);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_10d0);
  std::locale::~locale(local_10d0);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"0",(allocator *)local_3b8);
  std::locale::locale(local_b30,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_b30);
  pbVar2 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           (expected_f[3].field_2._M_local_buf + 8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_b30);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfe);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"0\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_10c8);
  std::locale::~locale(local_10c8);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<unsigned_long>((ulong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"18446744073709551615",(allocator *)local_3b8);
  std::locale::locale(local_b28,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_b28);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_b28);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfe);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"18446744073709551615\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"-1",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_b20,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_b20);
  std::locale::~locale(local_b20);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10c0);
  std::locale::~locale(local_10c0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  std::wistream::_M_extract<unsigned_long>((ulong *)(format.field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xff);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10b8);
  std::locale::~locale(local_10b8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions
            ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
             (int)(format.field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)(format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18))
            );
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_long>((ulong *)(format.field_2._M_local_buf + 8));
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xff);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Error limits reached, stopping unit test",(allocator *)local_3b8);
    booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_10b0);
  std::locale::~locale(local_10b0);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long_long>((longlong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string
            ((string *)local_b8,"-9,223,372,036,854,775,808",(allocator *)local_3b8);
  std::locale::locale(local_b18,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_b18);
  pbVar2 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           (expected_f[3].field_2._M_local_buf + 8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_b18);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x103);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"-9,223,372,036,854,775,808\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_10a8);
  std::locale::~locale(local_10a8);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long_long>((longlong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string
            ((string *)local_b8,"9,223,372,036,854,775,807",(allocator *)local_3b8);
  std::locale::locale(local_b10,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_b10);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_b10);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x103);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"9,223,372,036,854,775,807\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_10a0);
  std::locale::~locale(local_10a0);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"-9,223,372,036,854,775,808",
             (allocator *)local_b8);
  std::locale::locale(local_b08,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b08);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_b08);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long_long>((longlong *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != -0x8000000000000000) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x103);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<long long>::min())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x103);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1098);
  std::locale::~locale(local_1098);
  std::__cxx11::string::string
            ((string *)local_b8,"-9,223,372,036,854,775,808",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_b00,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_b00);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_b00);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long_long>((longlong *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != -0x8000000000000000) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x103);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<long long>::min())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x103);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1090);
  std::locale::~locale(local_1090);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"9,223,372,036,854,775,807",
             (allocator *)local_b8);
  std::locale::locale(local_af8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_af8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_af8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long_long>((longlong *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x7fffffffffffffff) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x103);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<long long>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x103);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1088);
  std::locale::~locale(local_1088);
  std::__cxx11::string::string
            ((string *)local_b8,"9,223,372,036,854,775,807",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_af0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_af0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_af0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long_long>((longlong *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x7fffffffffffffff) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x103);
    poVar8 = std::operator<<(poVar8," (v)==(std::numeric_limits<long long>::max())");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x103);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1080);
  std::locale::~locale(local_1080);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"0",(allocator *)local_3b8);
  std::locale::locale(local_ae8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_ae8);
  pbVar2 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           (&expected_f[3].field_2._M_allocated_capacity + 1);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_ae8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x105);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"0\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1078);
  std::locale::~locale(local_1078);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"18446744073709551615",(allocator *)local_3b8);
  std::locale::locale(local_ae0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_ae0);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_ae0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x105);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"18446744073709551615\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1070);
  std::locale::~locale(local_1070);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string
            ((string *)local_b8,"9,223,372,036,854,775,807",(allocator *)local_3b8);
  std::locale::locale(local_ad8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_ad8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_ad8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x106);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"9,223,372,036,854,775,807\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1068);
  std::locale::~locale(local_1068);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<unsigned_long_long>((ulonglong)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"9223372036854775808",(allocator *)local_3b8);
  std::locale::locale(local_ad0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_ad0);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_ad0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x107);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"9223372036854775808\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"-1",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_ac8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_ac8);
  std::locale::~locale(local_ac8);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1060);
  std::locale::~locale(local_1060);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  std::wistream::_M_extract<unsigned_long_long>((ulonglong *)(format.field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x108);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1058);
  std::locale::~locale(local_1058);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions
            ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
             (int)(format.field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)(format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18))
            );
  test_counter = test_counter + 1;
  std::wistream::_M_extract<unsigned_long_long>((ulonglong *)(format.field_2._M_local_buf + 8));
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x108);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Error limits reached, stopping unit test",(allocator *)local_3b8);
    booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1050);
  std::locale::~locale(local_1050);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xffffff4f |
       0x20;
  *(undefined8 *)((long)&result[0]._M_string_length + *(long *)(format.field_2._8_8_ + -0x18)) = 3;
  std::wostream::operator<<((wostream *)(format.field_2._M_local_buf + 8),0xf);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"15 ",(allocator *)local_3b8);
  std::locale::locale(local_ac0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_ac0);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_ac0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x10e);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"15 \",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1048);
  std::locale::~locale(local_1048);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"15 ",(allocator *)local_b8);
  std::locale::locale(local_ab8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_ab8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_ab8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xffffff4f |
       0x20;
  *(undefined8 *)((long)&result[0]._M_string_length + *(long *)(format.field_2._8_8_ + -0x18)) = 3;
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0xf) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x10e);
    poVar8 = std::operator<<(poVar8," (v)==(15)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x10e);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1040);
  std::locale::~locale(local_1040);
  std::__cxx11::string::string((string *)local_b8,"15 ",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_ab0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_ab0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_ab0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xffffff4f |
       0x20;
  *(undefined8 *)((long)&result[0]._M_string_length + *(long *)(format.field_2._8_8_ + -0x18)) = 3;
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0xf) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x10e);
    poVar8 = std::operator<<(poVar8," (v)==(15)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x10e);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1038);
  std::locale::~locale(local_1038);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xffffff4f |
       0x80;
  *(undefined8 *)((long)&result[0]._M_string_length + *(long *)(format.field_2._8_8_ + -0x18)) = 3;
  std::wostream::operator<<((wostream *)(format.field_2._M_local_buf + 8),0xf);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8," 15",(allocator *)local_3b8);
  std::locale::locale(local_aa8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_aa8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_aa8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x10f);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\" 15\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1030);
  std::locale::~locale(local_1030);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8)," 15",(allocator *)local_b8);
  std::locale::locale(local_aa0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_aa0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_aa0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xffffff4f |
       0x80;
  *(undefined8 *)((long)&result[0]._M_string_length + *(long *)(format.field_2._8_8_ + -0x18)) = 3;
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0xf) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x10f);
    poVar8 = std::operator<<(poVar8," (v)==(15)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x10f);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1028);
  std::locale::~locale(local_1028);
  std::__cxx11::string::string((string *)local_b8," 15",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_a98,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a98);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_a98);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xffffff4f |
       0x80;
  *(undefined8 *)((long)&result[0]._M_string_length + *(long *)(format.field_2._8_8_ + -0x18)) = 3;
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0xf) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x10f);
    poVar8 = std::operator<<(poVar8," (v)==(15)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x10f);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_1020);
  std::locale::~locale(local_1020);
  booster::locale::as::number
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  *(undefined8 *)((long)&result[0]._M_dataplus._M_p + *(long *)(format.field_2._8_8_ + -0x18)) = 3;
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xfffffefb |
       4;
  std::wostream::_M_insert<double>(13.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"13.100",(allocator *)local_3b8);
  std::locale::locale(local_a90,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_a90);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_a90);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x110);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"13.100\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1018);
  std::locale::~locale(local_1018);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"13.100",(allocator *)local_b8);
  std::locale::locale(local_a88,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a88);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_a88);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  *(undefined8 *)((long)&result[0]._M_dataplus._M_p + *(long *)(format.field_2._8_8_ + -0x18)) = 3;
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xfffffefb |
       4;
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 13.1) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x110);
    poVar8 = std::operator<<(poVar8," (v)==(13.1)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x110);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1010);
  std::locale::~locale(local_1010);
  std::__cxx11::string::string((string *)local_b8,"13.100",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_a80,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a80);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_a80);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  *(undefined8 *)((long)&result[0]._M_dataplus._M_p + *(long *)(format.field_2._8_8_ + -0x18)) = 3;
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xfffffefb |
       4;
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 13.1) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x110);
    poVar8 = std::operator<<(poVar8," (v)==(13.1)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x110);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_a78,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_a78);
  std::locale::~locale(local_a78);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1008);
  std::locale::~locale(local_1008);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_b8);
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x116);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_1000);
  std::locale::~locale(local_1000);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions
            ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
             (int)(format.field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)(format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18))
            );
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_b8);
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x116);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Error limits reached, stopping unit test",(allocator *)local_3b8);
    booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"--3",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_a70,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_a70);
  std::locale::~locale(local_a70);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ff8);
  std::locale::~locale(local_ff8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_b8);
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x117);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ff0);
  std::locale::~locale(local_ff0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions
            ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
             (int)(format.field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)(format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18))
            );
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_b8);
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x117);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Error limits reached, stopping unit test",(allocator *)local_3b8);
    booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"y",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_a68,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_a68);
  std::locale::~locale(local_a68);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fe8);
  std::locale::~locale(local_fe8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::number
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_b8);
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x118);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fe0);
  std::locale::~locale(local_fe0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions
            ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
             (int)(format.field_2._M_local_buf + 8));
  booster::locale::as::number
            ((ios_base *)(format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18))
            );
  test_counter = test_counter + 1;
  std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_b8);
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x118);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Error limits reached, stopping unit test",(allocator *)local_3b8);
    booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_fd8);
  std::locale::~locale(local_fd8);
  booster::locale::as::percent
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<double>(0.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"10%",(allocator *)local_3b8);
  std::locale::locale(local_a60,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_a60);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_a60);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11a);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"10%\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fd0);
  std::locale::~locale(local_fd0);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"10%",(allocator *)local_b8);
  std::locale::locale(local_a58,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a58);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_a58);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::percent
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 0.1) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11a);
    poVar8 = std::operator<<(poVar8," (v)==(0.1)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11a);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fc8);
  std::locale::~locale(local_fc8);
  std::__cxx11::string::string((string *)local_b8,"10%",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_a50,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a50);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_a50);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::percent
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 0.1) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11a);
    poVar8 = std::operator<<(poVar8," (v)==(0.1)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11a);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_fc0);
  std::locale::~locale(local_fc0);
  booster::locale::as::percent
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xfffffefb |
       4;
  *(undefined8 *)((long)&result[0]._M_dataplus._M_p + *(long *)(format.field_2._8_8_ + -0x18)) = 1;
  std::wostream::_M_insert<double>(0.1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"10.0%",(allocator *)local_3b8);
  std::locale::locale(local_a48,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_a48);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_a48);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11b);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"10.0%\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fb8);
  std::locale::~locale(local_fb8);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"10.0%",(allocator *)local_b8);
  std::locale::locale(local_a40,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a40);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_a40);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::percent
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xfffffefb |
       4;
  *(undefined8 *)((long)&result[0]._M_dataplus._M_p + *(long *)(format.field_2._8_8_ + -0x18)) = 1;
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 0.1) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11b);
    poVar8 = std::operator<<(poVar8," (v)==(0.1)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11b);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fb0);
  std::locale::~locale(local_fb0);
  std::__cxx11::string::string((string *)local_b8,"10.0%",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_a38,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a38);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_a38);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::percent
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) =
       *(uint *)((long)&result[0].field_2 + *(long *)(format.field_2._8_8_ + -0x18)) & 0xfffffefb |
       4;
  *(undefined8 *)((long)&result[0]._M_dataplus._M_p + *(long *)(format.field_2._8_8_ + -0x18)) = 1;
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 0.1) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11b);
    poVar8 = std::operator<<(poVar8," (v)==(0.1)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11b);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"1",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_a30,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_a30);
  std::locale::~locale(local_a30);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fa8);
  std::locale::~locale(local_fa8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::percent
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11d);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_fa0);
  std::locale::~locale(local_fa0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions
            ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
             (int)(format.field_2._M_local_buf + 8));
  booster::locale::as::percent
            ((ios_base *)(format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18))
            );
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11d);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Error limits reached, stopping unit test",(allocator *)local_3b8);
    booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_f98);
  std::locale::~locale(local_f98);
  booster::locale::as::currency
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::operator<<((wostream *)(format.field_2._M_local_buf + 8),0x541);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"$1,345.00",(allocator *)local_3b8);
  std::locale::locale(local_a28,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_a28);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_a28);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11f);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"$1,345.00\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f90);
  std::locale::~locale(local_f90);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"$1,345.00",(allocator *)local_b8);
  std::locale::locale(local_a20,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a20);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_a20);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0x541) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11f);
    poVar8 = std::operator<<(poVar8," (v)==(1345)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11f);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f88);
  std::locale::~locale(local_f88);
  std::__cxx11::string::string((string *)local_b8,"$1,345.00",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_a18,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a18);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_a18);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0x541) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11f);
    poVar8 = std::operator<<(poVar8," (v)==(1345)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x11f);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_f80);
  std::locale::~locale(local_f80);
  booster::locale::as::currency
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<double>(1345.34);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"$1,345.34",(allocator *)local_3b8);
  std::locale::locale(local_a10,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_a10);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_a10);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x120);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"$1,345.34\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f78);
  std::locale::~locale(local_f78);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"$1,345.34",(allocator *)local_b8);
  std::locale::locale(local_a08,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a08);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_a08);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 1345.34) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x120);
    poVar8 = std::operator<<(poVar8," (v)==(1345.34)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x120);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f70);
  std::locale::~locale(local_f70);
  std::__cxx11::string::string((string *)local_b8,"$1,345.34",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_a00,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_a00);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_a00);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 1345.34) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x120);
    poVar8 = std::operator<<(poVar8," (v)==(1345.34)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x120);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"$",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_9f8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_9f8);
  std::locale::~locale(local_9f8);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f68);
  std::locale::~locale(local_f68);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x122);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f60);
  std::locale::~locale(local_f60);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions
            ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
             (int)(format.field_2._M_local_buf + 8));
  booster::locale::as::currency
            ((ios_base *)(format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18))
            );
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x122);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Error limits reached, stopping unit test",(allocator *)local_3b8);
    booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_f58);
  std::locale::~locale(local_f58);
  booster::locale::as::currency((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::currency_national
            ((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::operator<<((wostream *)(format.field_2._M_local_buf + 8),0x541);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"$1,345.00",(allocator *)local_3b8);
  std::locale::locale(local_9f0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_9f0);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_9f0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x126);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"$1,345.00\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f50);
  std::locale::~locale(local_f50);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"$1,345.00",(allocator *)local_b8);
  std::locale::locale(local_9e8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_9e8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_9e8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::currency_national
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0x541) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x126);
    poVar8 = std::operator<<(poVar8," (v)==(1345)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x126);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f48);
  std::locale::~locale(local_f48);
  std::__cxx11::string::string((string *)local_b8,"$1,345.00",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_9e0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_9e0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_9e0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::currency_national
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0x541) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x126);
    poVar8 = std::operator<<(poVar8," (v)==(1345)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x126);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_f40);
  std::locale::~locale(local_f40);
  booster::locale::as::currency((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::currency_national
            ((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<double>(1345.34);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"$1,345.34",(allocator *)local_3b8);
  std::locale::locale(local_9d8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_9d8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_9d8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x127);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"$1,345.34\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f38);
  std::locale::~locale(local_f38);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"$1,345.34",(allocator *)local_b8);
  std::locale::locale(local_9d0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_9d0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_9d0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::currency_national
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 1345.34) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x127);
    poVar8 = std::operator<<(poVar8," (v)==(1345.34)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x127);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f30);
  std::locale::~locale(local_f30);
  std::__cxx11::string::string((string *)local_b8,"$1,345.34",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_9c8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_9c8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_9c8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::currency_national
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 1345.34) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x127);
    poVar8 = std::operator<<(poVar8," (v)==(1345.34)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x127);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_f28);
  std::locale::~locale(local_f28);
  booster::locale::as::currency((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::currency_iso((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::operator<<((wostream *)(format.field_2._M_local_buf + 8),0x541);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"USD1,345.00",(allocator *)local_3b8);
  std::locale::locale(local_9c0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_9c0);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_9c0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x128);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"USD1,345.00\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f20);
  std::locale::~locale(local_f20);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"USD1,345.00",(allocator *)local_b8)
  ;
  std::locale::locale(local_9b8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_9b8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_9b8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::currency_iso
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0x541) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x128);
    poVar8 = std::operator<<(poVar8," (v)==(1345)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x128);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f18);
  std::locale::~locale(local_f18);
  std::__cxx11::string::string((string *)local_b8,"USD1,345.00",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_9b0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_9b0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_9b0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::currency_iso
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 0x541) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x128);
    poVar8 = std::operator<<(poVar8," (v)==(1345)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x128);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_f10);
  std::locale::~locale(local_f10);
  booster::locale::as::currency((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::currency_iso((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<double>(1345.34);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"USD1,345.34",(allocator *)local_3b8);
  std::locale::locale(local_9a8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_9a8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_9a8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x129);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"USD1,345.34\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f08);
  std::locale::~locale(local_f08);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"USD1,345.34",(allocator *)local_b8)
  ;
  std::locale::locale(local_9a0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_9a0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_9a0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::currency_iso
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 1345.34) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x129);
    poVar8 = std::operator<<(poVar8," (v)==(1345.34)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x129);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_f00);
  std::locale::~locale(local_f00);
  std::__cxx11::string::string((string *)local_b8,"USD1,345.34",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_998,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_998);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_998);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::currency
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::currency_iso
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  dVar5 = (double)CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_));
  if ((dVar5 != 1345.34) || (NAN(dVar5))) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x129);
    poVar8 = std::operator<<(poVar8," (v)==(1345.34)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x129);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_ef8);
  std::locale::~locale(local_ef8);
  booster::locale::as::spellout
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::operator<<((wostream *)(format.field_2._M_local_buf + 8),10);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"ten",(allocator *)local_3b8);
  std::locale::locale(local_990,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_990);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_990);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,299);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"ten\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ef0);
  std::locale::~locale(local_ef0);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"ten",(allocator *)local_b8);
  std::locale::locale(local_988,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_988);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_988);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::spellout
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 10) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,299);
    poVar8 = std::operator<<(poVar8," (v)==(10)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,299);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ee8);
  std::locale::~locale(local_ee8);
  std::__cxx11::string::string((string *)local_b8,"ten",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_980,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_980);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_980);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::spellout
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = (wistream *)
           std::wistream::operator>>((wistream *)(format.field_2._M_local_buf + 8),(int *)local_3b8)
  ;
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT22(local_3b8._2_2_,local_3b8._0_2_) != 10) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,299);
    poVar8 = std::operator<<(poVar8," (v)==(10)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,299);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(format.field_2._M_local_buf + 8));
  std::wios::imbue(local_ee0);
  std::locale::~locale(local_ee0);
  booster::locale::as::ordinal
            ((ios_base *)
             ((wostringstream *)(format.field_2._M_local_buf + 8) +
             *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::operator<<((wostream *)(format.field_2._M_local_buf + 8),1);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"1st",(allocator *)local_3b8);
  std::locale::locale(local_978,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_978);
  pbVar2 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           (expected_f[3].field_2._M_local_buf + 8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_978);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x131);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"1st\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_ed8);
  std::locale::~locale(local_ed8);
  booster::locale::as::date((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"Feb 5, 1970",(allocator *)local_3b8);
  std::locale::locale(local_970,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_970);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,pbVar2);
  std::__cxx11::wstring::~wstring((wstring *)pbVar2);
  std::locale::~locale(local_970);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x139);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ed0);
  std::locale::~locale(local_ed0);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"Feb 5, 1970",(allocator *)local_b8)
  ;
  std::locale::locale(local_968,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_968);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_968);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::date
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2e2480) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x139);
    poVar8 = std::operator<<(poVar8," (v)==(a_date)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x139);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ec8);
  std::locale::~locale(local_ec8);
  std::__cxx11::string::string((string *)local_b8,"Feb 5, 1970",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_960,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_960);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_960);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::date
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2e2480) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x139);
    poVar8 = std::operator<<(poVar8," (v)==(a_date)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x139);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_ec0);
  std::locale::~locale(local_ec0);
  booster::locale::as::date((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::date_short((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"2/5/70",(allocator *)local_3b8);
  std::locale::locale(local_958,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_958);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_958);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13a);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"2/5/70\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_eb8);
  std::locale::~locale(local_eb8);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"2/5/70",(allocator *)local_b8);
  std::locale::locale(local_950,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_950);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_950);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::date
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::date_short
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2e2480) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13a);
    poVar8 = std::operator<<(poVar8," (v)==(a_date)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13a);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_eb0);
  std::locale::~locale(local_eb0);
  std::__cxx11::string::string((string *)local_b8,"2/5/70",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_948,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_948);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_948);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::date
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::date_short
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2e2480) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13a);
    poVar8 = std::operator<<(poVar8," (v)==(a_date)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13a);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_ea8);
  std::locale::~locale(local_ea8);
  booster::locale::as::date((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::date_medium((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"Feb 5, 1970",(allocator *)local_3b8);
  std::locale::locale(local_940,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_940);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_940);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13b);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_ea0);
  std::locale::~locale(local_ea0);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"Feb 5, 1970",(allocator *)local_b8)
  ;
  std::locale::locale(local_938,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_938);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_938);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::date
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::date_medium
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2e2480) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13b);
    poVar8 = std::operator<<(poVar8," (v)==(a_date)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13b);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e98);
  std::locale::~locale(local_e98);
  std::__cxx11::string::string((string *)local_b8,"Feb 5, 1970",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_930,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_930);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_930);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::date
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::date_medium
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2e2480) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13b);
    poVar8 = std::operator<<(poVar8," (v)==(a_date)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13b);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_e90);
  std::locale::~locale(local_e90);
  booster::locale::as::date((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::date_long((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"February 5, 1970",(allocator *)local_3b8);
  std::locale::locale(local_928,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_928);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_928);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13c);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"February 5, 1970\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e88);
  std::locale::~locale(local_e88);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"February 5, 1970",
             (allocator *)local_b8);
  std::locale::locale(local_920,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_920);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_920);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::date
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::date_long
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2e2480) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13c);
    poVar8 = std::operator<<(poVar8," (v)==(a_date)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13c);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e80);
  std::locale::~locale(local_e80);
  std::__cxx11::string::string((string *)local_b8,"February 5, 1970",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_918,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_918);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_918);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::date
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::date_long
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2e2480) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13c);
    poVar8 = std::operator<<(poVar8," (v)==(a_date)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13c);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_e78);
  std::locale::~locale(local_e78);
  booster::locale::as::date((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::date_full((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string
            ((string *)local_b8,"Thursday, February 5, 1970",(allocator *)local_3b8);
  std::locale::locale(local_910,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_910);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_910);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13d);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"Thursday, February 5, 1970\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e70);
  std::locale::~locale(local_e70);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"Thursday, February 5, 1970",
             (allocator *)local_b8);
  std::locale::locale(local_908,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_908);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_908);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::date
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::date_full
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2e2480) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13d);
    poVar8 = std::operator<<(poVar8," (v)==(a_date)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13d);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e68);
  std::locale::~locale(local_e68);
  std::__cxx11::string::string
            ((string *)local_b8,"Thursday, February 5, 1970",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_900,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_900);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_900);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::date
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::date_full
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2e2480) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13d);
    poVar8 = std::operator<<(poVar8," (v)==(a_date)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13d);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"aa/bb/cc",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_8f8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_8f8);
  std::locale::~locale(local_8f8);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e60);
  std::locale::~locale(local_e60);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::date
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::date_short
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13f);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pcVar4 = format.field_2._M_local_buf + 8;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e58);
  std::locale::~locale(local_e58);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) + (int)pcVar4);
  booster::locale::as::date((ios_base *)(pcVar4 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::date_short((ios_base *)(pcVar4 + *(long *)(format.field_2._8_8_ + -0x18)));
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x13f);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Error limits reached, stopping unit test",(allocator *)local_3b8);
    booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
    __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_e50);
  std::locale::~locale(local_e50);
  booster::locale::as::time((time_t *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"3:33:13 PM",(allocator *)local_3b8);
  std::locale::locale(local_8f0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_8f0);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_8f0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x147);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e48);
  std::locale::~locale(local_e48);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"3:33:13 PM",(allocator *)local_b8);
  std::locale::locale(local_8e8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_8e8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_8e8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::time((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8))
  ;
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x147);
    poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x147);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e40);
  std::locale::~locale(local_e40);
  std::__cxx11::string::string((string *)local_b8,"3:33:13 PM",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_8e0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_8e0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_8e0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::time((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8))
  ;
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x147);
    poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x147);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_e38);
  std::locale::~locale(local_e38);
  booster::locale::as::time((time_t *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::time_short((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"3:33 PM",(allocator *)local_3b8);
  std::locale::locale(local_8d8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_8d8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_8d8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x148);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"3:33 PM\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e30);
  std::locale::~locale(local_e30);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"3:33 PM",(allocator *)local_b8);
  std::locale::locale(local_8d0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_8d0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_8d0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::time((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8))
  ;
  booster::locale::as::time_short
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdaac) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x148);
    poVar8 = std::operator<<(poVar8," (v)==(a_time)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x148);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e28);
  std::locale::~locale(local_e28);
  std::__cxx11::string::string((string *)local_b8,"3:33 PM",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_8c8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_8c8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_8c8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::time((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8))
  ;
  booster::locale::as::time_short
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdaac) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x148);
    poVar8 = std::operator<<(poVar8," (v)==(a_time)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x148);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_e20);
  std::locale::~locale(local_e20);
  booster::locale::as::time((time_t *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::time_medium((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"3:33:13 PM",(allocator *)local_3b8);
  std::locale::locale(local_8c0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_8c0);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_8c0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x149);
    poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e18);
  std::locale::~locale(local_e18);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"3:33:13 PM",(allocator *)local_b8);
  std::locale::locale(local_8b8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_8b8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_8b8);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::time((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8))
  ;
  booster::locale::as::time_medium
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x149);
    poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x149);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e10);
  std::locale::~locale(local_e10);
  std::__cxx11::string::string((string *)local_b8,"3:33:13 PM",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_8b0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_8b0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_8b0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::time((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8))
  ;
  booster::locale::as::time_medium
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x149);
    poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x149);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_e08);
  std::locale::~locale(local_e08);
  booster::locale::as::time((time_t *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::time_long((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string((string *)local_b8,"3:33:13 PM GMT",(allocator *)local_3b8);
  std::locale::locale(local_8a8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_8a8);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_8a8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x14b);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM GMT\",loc))");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_e00);
  std::locale::~locale(local_e00);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"3:33:13 PM GMT",
             (allocator *)local_b8);
  std::locale::locale(local_8a0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_8a0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_8a0);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::time((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8))
  ;
  booster::locale::as::time_long
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x14b);
    poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x14b);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_df8);
  std::locale::~locale(local_df8);
  std::__cxx11::string::string((string *)local_b8,"3:33:13 PM GMT",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_898,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_898);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_898);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::time((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8))
  ;
  booster::locale::as::time_long
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x14b);
    poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x14b);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
  std::__cxx11::wostringstream::wostringstream(pwVar3);
  std::wios::imbue(local_df0);
  std::locale::~locale(local_df0);
  booster::locale::as::time((time_t *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::time_full((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
  std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  std::__cxx11::string::string
            ((string *)local_b8,"3:33:13 PM Greenwich Mean Time",(allocator *)local_3b8);
  std::locale::locale(local_890,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_890);
  _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_230,
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::~locale(local_890);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  if (!_Var6) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x14e);
    poVar8 = std::operator<<(poVar8,
                             " (ss.str())==(to_correct_string<CharType>(\"3:33:13 PM \" \"Greenwich Mean Time\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_de8);
  std::locale::~locale(local_de8);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),"3:33:13 PM Greenwich Mean Time",
             (allocator *)local_b8);
  std::locale::locale(local_888,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_888);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_888);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  booster::locale::as::time((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8))
  ;
  booster::locale::as::time_full
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x14e);
    poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x14e);
    poVar8 = std::operator<<(poVar8," ss.eof()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)(expected_f[3].field_2._M_local_buf + 8));
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_de0);
  std::locale::~locale(local_de0);
  std::__cxx11::string::string
            ((string *)local_b8,"3:33:13 PM Greenwich Mean Time",(allocator *)&local_728);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&expected_f[3].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@");
  std::locale::locale(local_880,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&expected_f[3].field_2 + 8),local_880);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::__cxx11::wstring::~wstring((wstring *)local_230);
  std::locale::~locale(local_880);
  std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b8);
  booster::locale::as::time((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8))
  ;
  booster::locale::as::time_full
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  booster::locale::as::gmt
            ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
  pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
  *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
       *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
  std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
  test_counter = test_counter + 1;
  if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x14e);
    poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (expected_f[3].field_2._8_4_ != 0x40) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x14e);
    poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_230,"Error limits reached, stopping unit test",
                 (allocator *)local_b8);
      booster::runtime_error::runtime_error(prVar15,(string *)local_230);
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string
            ((string *)(format.field_2._M_local_buf + 8),"AM",
             (allocator *)(expected_f[3].field_2._M_local_buf + 8));
  std::locale::locale(local_878,(locale *)(sample_f[3].field_2._M_local_buf + 8));
  to_correct_string<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_230
             ,(string *)((long)&format.field_2 + 8),local_878);
  std::locale::~locale(local_878);
  std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_dd8);
  std::locale::~locale(local_dd8);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  booster::locale::as::time((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8))
  ;
  std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  test_counter = test_counter + 1;
  if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 5U) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x155);
    poVar8 = std::operator<<(poVar8," ss.fail()");
    std::endl<char,std::char_traits<char>>(poVar8);
    iVar1 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar7) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(expected_f[3].field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_3b8);
      booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
      __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)(format.field_2._M_local_buf + 8))
  ;
  std::__cxx11::wistringstream::basic_istringstream();
  std::wios::imbue(local_dd0);
  std::locale::~locale(local_dd0);
  std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
  std::wios::exceptions
            ((int)*(undefined8 *)(format.field_2._8_8_ + -0x18) +
             (int)(format.field_2._M_local_buf + 8));
  booster::locale::as::time
            ((time_t *)(format.field_2._M_local_buf + 8 + *(long *)(format.field_2._8_8_ + -0x18)));
  test_counter = test_counter + 1;
  std::wistream::_M_extract<double>((double *)((long)&format.field_2 + 8));
  poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x155);
  poVar8 = std::operator<<(poVar8," ss >> v");
  std::endl<char,std::char_traits<char>>(poVar8);
  if (error_counter < 0x15) {
    error_counter = error_counter + 1;
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::__cxx11::wostringstream::wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::wios::imbue(local_dc8);
    std::locale::~locale(local_dc8);
    booster::locale::as::time
              ((time_t *)
               ((wostringstream *)(format.field_2._M_local_buf + 8) +
               *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar11 = booster::locale::as::details::operator<<
                        ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    std::wostream::_M_insert<long>((long)pbVar11);
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string((string *)local_b8,"4:33:13 PM",(allocator *)local_3b8);
    std::locale::locale(local_870,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_870);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
    std::locale::~locale(local_870);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x157);
      poVar8 = std::operator<<(poVar8,
                               " (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM\",loc))");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_dc0);
    std::locale::~locale(local_dc0);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),"4:33:13 PM",(allocator *)local_b8
              );
    std::locale::locale(local_868,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_868);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_868);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    booster::locale::as::time
              ((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar12 = booster::locale::as::details::operator>>
                        ((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    pwVar9 = std::wistream::_M_extract<long>((long *)pbVar12);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x157);
      poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x157);
      poVar8 = std::operator<<(poVar8," ss.eof()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_db8);
    std::locale::~locale(local_db8);
    std::__cxx11::string::string((string *)local_b8,"4:33:13 PM",(allocator *)&local_728);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expected_f[3].field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@"
                  );
    std::locale::locale(local_860,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_860);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_860);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b8);
    booster::locale::as::time
              ((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar12 = booster::locale::as::details::operator>>
                        ((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    pwVar9 = std::wistream::_M_extract<long>((long *)pbVar12);
    *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
         *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x157);
      poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (expected_f[3].field_2._8_4_ != 0x40) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x157);
      poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar3);
    std::wios::imbue(local_db0);
    std::locale::~locale(local_db0);
    booster::locale::as::time((time_t *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::time_short((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar11 = booster::locale::as::details::operator<<
                        ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    std::wostream::_M_insert<long>((long)pbVar11);
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string((string *)local_b8,"4:33 PM",(allocator *)local_3b8);
    std::locale::locale(local_858,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_858);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
    std::locale::~locale(local_858);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x158);
      poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(\"4:33 PM\",loc))")
      ;
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_da8);
    std::locale::~locale(local_da8);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),"4:33 PM",(allocator *)local_b8);
    std::locale::locale(local_850,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_850);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_850);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    booster::locale::as::time
              ((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_short
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar12 = booster::locale::as::details::operator>>
                        ((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    pwVar9 = std::wistream::_M_extract<long>((long *)pbVar12);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdaac) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x158);
      poVar8 = std::operator<<(poVar8," (v)==(a_time)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x158);
      poVar8 = std::operator<<(poVar8," ss.eof()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_da0);
    std::locale::~locale(local_da0);
    std::__cxx11::string::string((string *)local_b8,"4:33 PM",(allocator *)&local_728);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expected_f[3].field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@"
                  );
    std::locale::locale(local_848,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_848);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_848);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b8);
    booster::locale::as::time
              ((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_short
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar12 = booster::locale::as::details::operator>>
                        ((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    pwVar9 = std::wistream::_M_extract<long>((long *)pbVar12);
    *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
         *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdaac) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x158);
      poVar8 = std::operator<<(poVar8," (v)==(a_time)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (expected_f[3].field_2._8_4_ != 0x40) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x158);
      poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar3);
    std::wios::imbue(local_d98);
    std::locale::~locale(local_d98);
    booster::locale::as::time((time_t *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::time_medium((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)))
    ;
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar11 = booster::locale::as::details::operator<<
                        ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    std::wostream::_M_insert<long>((long)pbVar11);
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string((string *)local_b8,"4:33:13 PM",(allocator *)local_3b8);
    std::locale::locale(local_840,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_840);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
    std::locale::~locale(local_840);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x159);
      poVar8 = std::operator<<(poVar8,
                               " (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM\",loc))");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d90);
    std::locale::~locale(local_d90);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),"4:33:13 PM",(allocator *)local_b8
              );
    std::locale::locale(local_838,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_838);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_838);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    booster::locale::as::time
              ((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_medium
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar12 = booster::locale::as::details::operator>>
                        ((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    pwVar9 = std::wistream::_M_extract<long>((long *)pbVar12);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x159);
      poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x159);
      poVar8 = std::operator<<(poVar8," ss.eof()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d88);
    std::locale::~locale(local_d88);
    std::__cxx11::string::string((string *)local_b8,"4:33:13 PM",(allocator *)&local_728);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expected_f[3].field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@"
                  );
    std::locale::locale(local_830,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_830);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_830);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b8);
    booster::locale::as::time
              ((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_medium
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar12 = booster::locale::as::details::operator>>
                        ((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    pwVar9 = std::wistream::_M_extract<long>((long *)pbVar12);
    *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
         *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x159);
      poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (expected_f[3].field_2._8_4_ != 0x40) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x159);
      poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar3);
    std::wios::imbue(local_d80);
    std::locale::~locale(local_d80);
    booster::locale::as::time((time_t *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::time_long((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar11 = booster::locale::as::details::operator<<
                        ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    std::wostream::_M_insert<long>((long)pbVar11);
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string((string *)local_b8,"4:33:13 PM GMT+1",(allocator *)local_3b8);
    std::locale::locale(local_828,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_828);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
    std::locale::~locale(local_828);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x16a);
      poVar8 = std::operator<<(poVar8,
                               " (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM \" \"GMT+1\",loc))"
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d78);
    std::locale::~locale(local_d78);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),"4:33:13 PM GMT+1",
               (allocator *)local_b8);
    std::locale::locale(local_820,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_820);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_820);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    booster::locale::as::time
              ((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_long
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar12 = booster::locale::as::details::operator>>
                        ((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    pwVar9 = std::wistream::_M_extract<long>((long *)pbVar12);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x16a);
      poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x16a);
      poVar8 = std::operator<<(poVar8," ss.eof()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d70);
    std::locale::~locale(local_d70);
    std::__cxx11::string::string((string *)local_b8,"4:33:13 PM GMT+1",(allocator *)&local_728);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expected_f[3].field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@"
                  );
    std::locale::locale(local_818,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_818);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_818);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b8);
    booster::locale::as::time
              ((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_long
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar12 = booster::locale::as::details::operator>>
                        ((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    pwVar9 = std::wistream::_M_extract<long>((long *)pbVar12);
    *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
         *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x16a);
      poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (expected_f[3].field_2._8_4_ != 0x40) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x16a);
      poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar3);
    std::wios::imbue(local_d68);
    std::locale::~locale(local_d68);
    booster::locale::as::time((time_t *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::time_full((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar11 = booster::locale::as::details::operator<<
                        ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    std::wostream::_M_insert<long>((long)pbVar11);
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string((string *)local_b8,"4:33:13 PM GMT+01:00",(allocator *)local_3b8);
    std::locale::locale(local_810,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_810);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
    std::locale::~locale(local_810);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x16e);
      poVar8 = std::operator<<(poVar8,
                               " (ss.str())==(to_correct_string<CharType>(\"4:33:13 PM GMT+01:00\",loc))"
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d60);
    std::locale::~locale(local_d60);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),"4:33:13 PM GMT+01:00",
               (allocator *)local_b8);
    std::locale::locale(local_808,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_808);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_808);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    booster::locale::as::time
              ((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_full
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar12 = booster::locale::as::details::operator>>
                        ((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    pwVar9 = std::wistream::_M_extract<long>((long *)pbVar12);
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x16e);
      poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x16e);
      poVar8 = std::operator<<(poVar8," ss.eof()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d58);
    std::locale::~locale(local_d58);
    std::__cxx11::string::string((string *)local_b8,"4:33:13 PM GMT+01:00",(allocator *)&local_728);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expected_f[3].field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@"
                  );
    std::locale::locale(local_800,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_800);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_800);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b8);
    booster::locale::as::time
              ((time_t *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_full
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_zone((set_timezone *)local_230,"GMT+01:00");
    pbVar12 = booster::locale::as::details::operator>>
                        ((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(set_timezone *)local_230);
    pwVar9 = std::wistream::_M_extract<long>((long *)pbVar12);
    *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
         *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_230);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0xdab9) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x16e);
      poVar8 = std::operator<<(poVar8," (v)==(a_time+a_timesec)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (expected_f[3].field_2._8_4_ != 0x40) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x16e);
      poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar3);
    std::wios::imbue(local_d50);
    std::locale::~locale(local_d50);
    booster::locale::as::datetime((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string
              ((string *)local_b8,"Feb 5, 1970, 3:33:13 PM",(allocator *)local_3b8);
    std::locale::locale(local_7f8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_7f8);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
    std::locale::~locale(local_7f8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x171);
      poVar8 = std::operator<<(poVar8,
                               " (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\" \",\" \" 3:33:13 PM\",loc))"
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d48);
    std::locale::~locale(local_d48);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),"Feb 5, 1970, 3:33:13 PM",
               (allocator *)local_b8);
    std::locale::locale(local_7f0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_7f0);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_7f0);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    booster::locale::as::datetime
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::gmt
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2eff39) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x171);
      poVar8 = std::operator<<(poVar8," (v)==(a_datetime)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x171);
      poVar8 = std::operator<<(poVar8," ss.eof()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d40);
    std::locale::~locale(local_d40);
    std::__cxx11::string::string
              ((string *)local_b8,"Feb 5, 1970, 3:33:13 PM",(allocator *)&local_728);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expected_f[3].field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@"
                  );
    std::locale::locale(local_7e8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_7e8);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_7e8);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b8);
    booster::locale::as::datetime
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::gmt
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
    *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
         *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2eff39) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x171);
      poVar8 = std::operator<<(poVar8," (v)==(a_datetime)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (expected_f[3].field_2._8_4_ != 0x40) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x171);
      poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar3);
    std::wios::imbue(local_d38);
    std::locale::~locale(local_d38);
    booster::locale::as::datetime((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::date_short((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::time_short((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string((string *)local_b8,"2/5/70, 3:33 PM",(allocator *)local_3b8);
    std::locale::locale(local_7e0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_7e0);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
    std::locale::~locale(local_7e0);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x172);
      poVar8 = std::operator<<(poVar8,
                               " (ss.str())==(to_correct_string<CharType>(\"2/5/70\" \",\" \" 3:33 PM\",loc))"
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d30);
    std::locale::~locale(local_d30);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),"2/5/70, 3:33 PM",
               (allocator *)local_b8);
    std::locale::locale(local_7d8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_7d8);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_7d8);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    booster::locale::as::datetime
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::date_short
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_short
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::gmt
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2eff2c) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x172);
      poVar8 = std::operator<<(poVar8," (v)==(a_date+a_time)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x172);
      poVar8 = std::operator<<(poVar8," ss.eof()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d28);
    std::locale::~locale(local_d28);
    std::__cxx11::string::string((string *)local_b8,"2/5/70, 3:33 PM",(allocator *)&local_728);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expected_f[3].field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@"
                  );
    std::locale::locale(local_7d0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_7d0);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_7d0);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b8);
    booster::locale::as::datetime
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::date_short
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_short
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::gmt
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
    *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
         *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2eff2c) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x172);
      poVar8 = std::operator<<(poVar8," (v)==(a_date+a_time)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (expected_f[3].field_2._8_4_ != 0x40) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x172);
      poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar3);
    std::wios::imbue(local_d20);
    std::locale::~locale(local_d20);
    booster::locale::as::datetime((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::date_medium((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)))
    ;
    booster::locale::as::time_medium((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)))
    ;
    booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string
              ((string *)local_b8,"Feb 5, 1970, 3:33:13 PM",(allocator *)local_3b8);
    std::locale::locale(local_7c8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_7c8);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
    std::locale::~locale(local_7c8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x173);
      poVar8 = std::operator<<(poVar8,
                               " (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970\" \",\" \" 3:33:13 PM\",loc))"
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d18);
    std::locale::~locale(local_d18);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),"Feb 5, 1970, 3:33:13 PM",
               (allocator *)local_b8);
    std::locale::locale(local_7c0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_7c0);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_7c0);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    booster::locale::as::datetime
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::date_medium
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_medium
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::gmt
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2eff39) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x173);
      poVar8 = std::operator<<(poVar8," (v)==(a_datetime)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x173);
      poVar8 = std::operator<<(poVar8," ss.eof()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d10);
    std::locale::~locale(local_d10);
    std::__cxx11::string::string
              ((string *)local_b8,"Feb 5, 1970, 3:33:13 PM",(allocator *)&local_728);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expected_f[3].field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@"
                  );
    std::locale::locale(local_7b8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_7b8);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_7b8);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b8);
    booster::locale::as::datetime
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::date_medium
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_medium
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::gmt
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
    *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
         *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2eff39) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x173);
      poVar8 = std::operator<<(poVar8," (v)==(a_datetime)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (expected_f[3].field_2._8_4_ != 0x40) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x173);
      poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar3);
    std::wios::imbue(local_d08);
    std::locale::~locale(local_d08);
    booster::locale::as::datetime((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::date_long((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::time_long((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string
              ((string *)local_b8,"February 5, 1970 at 3:33:13 PM GMT",(allocator *)local_3b8);
    std::locale::locale(local_7b0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_7b0);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
    std::locale::~locale(local_7b0);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x175);
      poVar8 = std::operator<<(poVar8,
                               " (ss.str())==(to_correct_string<CharType>(\"February 5, 1970\" \" at\" \" 3:33:13 PM GMT\",loc))"
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_d00);
    std::locale::~locale(local_d00);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "February 5, 1970 at 3:33:13 PM GMT",(allocator *)local_b8);
    std::locale::locale(local_7a8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_7a8);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_7a8);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    booster::locale::as::datetime
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::date_long
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_long
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::gmt
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2eff39) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x175);
      poVar8 = std::operator<<(poVar8," (v)==(a_datetime)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x175);
      poVar8 = std::operator<<(poVar8," ss.eof()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_cf8);
    std::locale::~locale(local_cf8);
    std::__cxx11::string::string
              ((string *)local_b8,"February 5, 1970 at 3:33:13 PM GMT",(allocator *)&local_728);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expected_f[3].field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@"
                  );
    std::locale::locale(local_7a0,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_7a0);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_7a0);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b8);
    booster::locale::as::datetime
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::date_long
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_long
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::gmt
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
    *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
         *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2eff39) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x175);
      poVar8 = std::operator<<(poVar8," (v)==(a_datetime)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (expected_f[3].field_2._8_4_ != 0x40) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x175);
      poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    pwVar3 = (wostringstream *)(format.field_2._M_local_buf + 8);
    std::__cxx11::wostringstream::wostringstream(pwVar3);
    std::wios::imbue(local_cf0);
    std::locale::~locale(local_cf0);
    booster::locale::as::datetime((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::date_full((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::time_full((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    booster::locale::as::gmt((ios_base *)(pwVar3 + *(long *)(format.field_2._8_8_ + -0x18)));
    std::wostream::_M_insert<long>((long)((long)&format.field_2 + 8));
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string
              ((string *)local_b8,"Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time",
               (allocator *)local_3b8);
    std::locale::locale(local_798,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&expected_f[3].field_2 + 8),(string *)local_b8,local_798);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::wstring::~wstring((wstring *)(expected_f[3].field_2._M_local_buf + 8));
    std::locale::~locale(local_798);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x178);
      poVar8 = std::operator<<(poVar8,
                               " (ss.str())==(to_correct_string<CharType>(\"Thursday, February 5, 1970\" \" at\" \" 3:33:13 PM \" \"Greenwich Mean Time\",loc))"
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_ce8);
    std::locale::~locale(local_ce8);
    std::__cxx11::string::string
              ((string *)(expected_f[3].field_2._M_local_buf + 8),
               "Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time",(allocator *)local_b8)
    ;
    std::locale::locale(local_790,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_790);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_790);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    booster::locale::as::datetime
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::date_full
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_full
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::gmt
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
    std::ws<wchar_t,std::char_traits<wchar_t>>(pwVar9);
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2eff39) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x178);
      poVar8 = std::operator<<(poVar8," (v)==(a_datetime)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if ((result[0].field_2._M_local_buf[*(long *)(format.field_2._8_8_ + -0x18) + 8] & 2U) == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x178);
      poVar8 = std::operator<<(poVar8," ss.eof()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)(expected_f[3].field_2._M_local_buf + 8));
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wistringstream::basic_istringstream();
    std::wios::imbue(local_ce0);
    std::locale::~locale(local_ce0);
    std::__cxx11::string::string
              ((string *)local_b8,"Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time",
               (allocator *)&local_728);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&expected_f[3].field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,"@"
                  );
    std::locale::locale(local_788,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_230,(string *)((long)&expected_f[3].field_2 + 8),local_788);
    std::__cxx11::wstringbuf::str((wstring *)&result[0]._M_string_length);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    std::locale::~locale(local_788);
    std::__cxx11::string::~string((string *)(expected_f[3].field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_b8);
    booster::locale::as::datetime
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::date_full
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::time_full
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    booster::locale::as::gmt
              ((ios_base *)((long)result + *(long *)(format.field_2._8_8_ + -0x18) + -8));
    pwVar9 = std::wistream::_M_extract<long>((long *)(format.field_2._M_local_buf + 8));
    *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) =
         *(uint *)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0x18) | 0x1000;
    std::operator>>(pwVar9,(wchar_t *)(expected_f[3].field_2._M_local_buf + 8));
    test_counter = test_counter + 1;
    if (CONCAT44(local_3b8._4_4_,CONCAT22(local_3b8._2_2_,local_3b8._0_2_)) != 0x2eff39) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x178);
      poVar8 = std::operator<<(poVar8," (v)==(a_datetime)");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    test_counter = test_counter + 1;
    if (expected_f[3].field_2._8_4_ != 0x40) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x178);
      poVar8 = std::operator<<(poVar8," tmp_c==\'@\'");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wistringstream::~wistringstream
              ((wistringstream *)(format.field_2._M_local_buf + 8));
    tVar13 = time((time_t *)0x0);
    local_cd8 = tVar13 + 0x3840;
    std::__cxx11::string::string
              ((string *)&local_728,"%H:%M:%S",(allocator *)(format.field_2._M_local_buf + 8));
    local_768 = (undefined1  [8])&format_string._M_string_length;
    std::__cxx11::wstring::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((wstring *)local_768,local_728,format._M_dataplus._M_p + (long)local_728);
    __tp = gmtime(&local_cd8);
    strftime(expected_f[3].field_2._M_local_buf + 8,0x100,local_728,__tp);
    std::__cxx11::wostringstream::wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::wios::imbue((locale *)&lnow);
    std::locale::~locale((locale *)&lnow);
    booster::locale::as::ftime<wchar_t>
              ((add_ftime<wchar_t> *)local_230,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_768);
    pbVar11 = booster::locale::as::details::operator<<
                        ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(add_ftime<wchar_t> *)local_230);
    std::wostream::_M_insert<long>((long)pbVar11);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string
              ((string *)local_3b8,expected_f[3].field_2._M_local_buf + 8,local_1260);
    std::locale::locale(local_780,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_b8,(string *)local_3b8,local_780);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_b8);
    std::locale::~locale(local_780);
    std::__cxx11::string::~string((string *)local_3b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x185);
      poVar8 = std::operator<<(poVar8,
                               " (ss.str())==(to_correct_string<CharType>(local_time_str,loc))");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::wostringstream::wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::wios::imbue(local_cc8);
    std::locale::~locale(local_cc8);
    booster::locale::as::ftime<wchar_t>
              ((add_ftime<wchar_t> *)local_230,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_768);
    pbVar11 = booster::locale::as::details::operator<<
                        ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)
                         (format.field_2._M_local_buf + 8),(add_ftime<wchar_t> *)local_230);
    booster::locale::as::gmt((ios_base *)(pbVar11 + *(long *)(*(long *)pbVar11 + -0x18)));
    booster::locale::as::local_time((ios_base *)(pbVar11 + *(long *)(*(long *)pbVar11 + -0x18)));
    std::wostream::_M_insert<long>((long)pbVar11);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    std::__cxx11::string::string
              ((string *)local_3b8,expected_f[3].field_2._M_local_buf + 8,local_1260);
    std::locale::locale(local_778,(locale *)(sample_f[3].field_2._M_local_buf + 8));
    to_correct_string<wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_b8,(string *)local_3b8,local_778);
    _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_230,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_b8);
    std::locale::~locale(local_778);
    std::__cxx11::string::~string((string *)local_3b8);
    std::__cxx11::wstring::~wstring((wstring *)local_230);
    if (!_Var6) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x186);
      poVar8 = std::operator<<(poVar8,
                               " (ss.str())==(to_correct_string<CharType>(local_time_str,loc))");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_230,"Error limits reached, stopping unit test",
                   (allocator *)local_b8);
        booster::runtime_error::runtime_error(prVar15,(string *)local_230);
        __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::__cxx11::wostringstream::~wostringstream
              ((wostringstream *)(format.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)local_1260,"aAbBcdehHIjmMnprRStTxXyYZ%",
               (allocator *)(format.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)(format.field_2._M_local_buf + 8),"Thu",(allocator *)local_230);
    std::__cxx11::string::string
              ((string *)(result[0].field_2._M_local_buf + 8),"Thursday",(allocator *)local_b8);
    std::__cxx11::string::string
              ((string *)(result[1].field_2._M_local_buf + 8),"Feb",(allocator *)local_3b8);
    std::__cxx11::string::string
              ((string *)(result[2].field_2._M_local_buf + 8),"February",(allocator *)&local_ca0);
    std::__cxx11::string::string
              ((string *)(result[3].field_2._M_local_buf + 8),
               "Thursday, February 5, 1970 at 3:33:13 PM Greenwich Mean Time",
               (allocator *)&local_1280);
    std::__cxx11::string::string((string *)(result[4].field_2._M_local_buf + 8),"05",&local_3b9);
    std::__cxx11::string::string((string *)(result[5].field_2._M_local_buf + 8),"5",&local_73c);
    std::__cxx11::string::string((string *)(result[6].field_2._M_local_buf + 8),"Feb",&local_73b);
    std::__cxx11::string::string((string *)(result[7].field_2._M_local_buf + 8),"15",&local_73a);
    std::__cxx11::string::string((string *)(result[8].field_2._M_local_buf + 8),"03",&local_739);
    std::__cxx11::string::string((string *)(result[9].field_2._M_local_buf + 8),"36",&local_738);
    std::__cxx11::string::string((string *)(result[10].field_2._M_local_buf + 8),"02",&local_737);
    std::__cxx11::string::string((string *)(result[0xb].field_2._M_local_buf + 8),"33",&local_736);
    std::__cxx11::string::string((string *)(result[0xc].field_2._M_local_buf + 8),"\n",&local_735);
    std::__cxx11::string::string((string *)(result[0xd].field_2._M_local_buf + 8),"PM",&local_734);
    std::__cxx11::string::string
              ((string *)(result[0xe].field_2._M_local_buf + 8),"03:33:13 PM",&local_733);
    std::__cxx11::string::string
              ((string *)(result[0xf].field_2._M_local_buf + 8),"15:33",&local_732);
    std::__cxx11::string::string((string *)(result[0x10].field_2._M_local_buf + 8),"13",&local_731);
    std::__cxx11::string::string((string *)(result[0x11].field_2._M_local_buf + 8),"\t",&local_730);
    std::__cxx11::string::string
              ((string *)(result[0x12].field_2._M_local_buf + 8),"15:33:13",&local_72f);
    std::__cxx11::string::string
              ((string *)(result[0x13].field_2._M_local_buf + 8),"Feb 5, 1970",&local_72e);
    std::__cxx11::string::string
              ((string *)(result[0x14].field_2._M_local_buf + 8),"3:33:13 PM",&local_72d);
    std::__cxx11::string::string((string *)(result[0x15].field_2._M_local_buf + 8),"70",&local_72c);
    std::__cxx11::string::string
              ((string *)(result[0x16].field_2._M_local_buf + 8),"1970",&local_72b);
    std::__cxx11::string::string
              ((string *)(result[0x17].field_2._M_local_buf + 8),"Greenwich Mean Time",&local_72a);
    std::__cxx11::string::string((string *)(result[0x18].field_2._M_local_buf + 8),"%",&local_729);
    uVar16 = 0;
    do {
      if (marks._M_dataplus._M_p <= (pointer)(ulong)uVar16) {
        std::__cxx11::string::string
                  ((string *)local_b8,"Now is %A, %H o\'clo\'\'ck \' or not \' ",
                   (allocator *)local_230);
        std::__cxx11::string::string
                  ((string *)(sample_f[0].field_2._M_local_buf + 8),"\'test %H\'",
                   (allocator *)local_3b8);
        std::__cxx11::string::string
                  ((string *)(sample_f[1].field_2._M_local_buf + 8),"%H\'",(allocator *)&local_ca0);
        std::__cxx11::string::string
                  ((string *)(sample_f[2].field_2._M_local_buf + 8),"\'%H\'",
                   (allocator *)&local_1280);
        std::__cxx11::string::string
                  ((string *)local_3b8,"Now is Thursday, 15 o\'clo\'\'ck \' or not \' ",
                   (allocator *)local_230);
        std::__cxx11::string::string
                  ((string *)(expected_f[0].field_2._M_local_buf + 8),"\'test 15\'",
                   (allocator *)&local_ca0);
        std::__cxx11::string::string
                  ((string *)(expected_f[1].field_2._M_local_buf + 8),"15\'",
                   (allocator *)&local_1280);
        std::__cxx11::string::string
                  ((string *)(expected_f[2].field_2._M_local_buf + 8),"\'15\'",&local_3b9);
        lVar14 = 0;
        do {
          if (lVar14 == 0x80) {
            lVar14 = 0x60;
            do {
              std::__cxx11::string::~string((string *)(local_3b8 + lVar14));
              lVar14 = lVar14 + -0x20;
            } while (lVar14 != -0x20);
            lVar14 = 0x60;
            do {
              std::__cxx11::string::~string((string *)(local_b8 + lVar14));
              lVar14 = lVar14 + -0x20;
            } while (lVar14 != -0x20);
            lVar14 = 800;
            do {
              std::__cxx11::string::~string((string *)((long)result + lVar14 + -8));
              lVar14 = lVar14 + -0x20;
            } while (lVar14 != -0x20);
            std::__cxx11::string::~string((string *)local_1260);
            std::__cxx11::wstring::~wstring((wstring *)local_768);
            std::__cxx11::string::~string((string *)&local_728);
            std::locale::~locale((locale *)(sample_f[3].field_2._M_local_buf + 8));
            booster::locale::generator::~generator((generator *)((long)&format_string.field_2 + 8));
            return;
          }
          local_770 = lVar14;
          std::__cxx11::wstring::
          assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((wstring *)local_768,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )*(char **)(local_b8 + lVar14),
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(*(char **)(local_b8 + lVar14) +
                       *(long *)((long)&sample_f[0]._M_dataplus._M_p + lVar14)));
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_230);
          std::wios::imbue(local_cb0);
          std::locale::~locale(local_cb0);
          booster::locale::as::ftime<wchar_t>
                    ((add_ftime<wchar_t> *)&local_ca0,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_768);
          pbVar11 = booster::locale::as::details::operator<<
                              ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_230,
                               (add_ftime<wchar_t> *)&local_ca0);
          booster::locale::as::gmt((ios_base *)(pbVar11 + *(long *)(*(long *)pbVar11 + -0x18)));
          std::wostream::_M_insert<long>((long)pbVar11);
          std::__cxx11::wstring::~wstring((wstring *)&local_ca0);
          test_counter = test_counter + 1;
          std::__cxx11::wstringbuf::str();
          e = (string *)(local_3b8 + local_770);
          std::locale::locale(local_ca8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
          to_correct_string<wchar_t>(&local_1280,e,local_ca8);
          _Var6 = std::operator==(&local_ca0,&local_1280);
          std::__cxx11::wstring::~wstring((wstring *)&local_1280);
          std::locale::~locale(local_ca8);
          std::__cxx11::wstring::~wstring((wstring *)&local_ca0);
          if (!_Var6) {
            poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x1ba);
            poVar8 = std::operator<<(poVar8,
                                     " (ss.str())==(to_correct_string<CharType>(expected_f[i],loc))"
                                    );
            std::endl<char,std::char_traits<char>>(poVar8);
            iVar1 = error_counter + 1;
            bVar7 = 0x14 < error_counter;
            error_counter = iVar1;
            if (bVar7) {
              prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string
                        ((string *)&local_ca0,"Error limits reached, stopping unit test",
                         (allocator *)&local_1280);
              booster::runtime_error::runtime_error(prVar15,(string *)&local_ca0);
              __cxa_throw(prVar15,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
          std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_230);
          lVar14 = local_770 + 0x20;
        } while( true );
      }
      format_string._M_dataplus._M_p = (pointer)0x0;
      *(wchar_t *)local_768 = L'\0';
      std::__cxx11::wstring::push_back((wchar_t)local_768);
      std::__cxx11::wstring::push_back((wchar_t)local_768);
      std::__cxx11::wostringstream::wostringstream((wostringstream *)local_230);
      std::wios::imbue(local_cc0);
      std::locale::~locale(local_cc0);
      booster::locale::as::ftime<wchar_t>
                ((add_ftime<wchar_t> *)local_b8,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_768);
      pbVar11 = booster::locale::as::details::operator<<
                          ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_230,
                           (add_ftime<wchar_t> *)local_b8);
      booster::locale::as::gmt((ios_base *)(pbVar11 + *(long *)(*(long *)pbVar11 + -0x18)));
      std::wostream::_M_insert<long>((long)pbVar11);
      std::__cxx11::wstring::~wstring((wstring *)local_b8);
      test_counter = test_counter + 1;
      std::__cxx11::wstringbuf::str();
      std::locale::locale(local_cb8,(locale *)(sample_f[3].field_2._M_local_buf + 8));
      to_correct_string<wchar_t>
                ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_3b8,
                 (string *)((long)&result[(long)((pointer)(ulong)uVar16 + -1)].field_2 + 8),
                 local_cb8);
      _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)local_b8,
                              (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)local_3b8);
      std::__cxx11::wstring::~wstring((wstring *)local_3b8);
      std::locale::~locale(local_cb8);
      std::__cxx11::wstring::~wstring((wstring *)local_b8);
      if (!_Var6) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x1a8);
        poVar8 = std::operator<<(poVar8," (ss.str())==(to_correct_string<CharType>(result[i],loc))")
        ;
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 0x14 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)local_b8,"Error limits reached, stopping unit test",
                     (allocator *)local_3b8);
          booster::runtime_error::runtime_error(prVar15,(string *)local_b8);
          __cxa_throw(prVar15,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_230);
      uVar16 = uVar16 + 1;
    } while( true );
  }
  error_counter = error_counter + 1;
  prVar15 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)(expected_f[3].field_2._M_local_buf + 8),
             "Error limits reached, stopping unit test",(allocator *)local_3b8);
  booster::runtime_error::runtime_error(prVar15,(string *)((long)&expected_f[3].field_2 + 8));
  __cxa_throw(prVar15,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void test_manip(std::string e_charset="UTF-8")
{
    booster::locale::generator g;
    std::locale loc=g("en_US."+e_charset);
    
    TEST_FP1(as::posix,1200.1,"1200.1",double,1200.1);
    TEST_FP1(as::number,1200.1,"1,200.1",double,1200.1);
    TEST_FMT(as::number<<std::setfill(CharType('_'))<<std::setw(6),1534,"_1,534");
    TEST_FMT(as::number<<std::left<<std::setfill(CharType('_'))<<std::setw(6),1534,"1,534_");
    
    // Ranges
    if(sizeof(short) == 2) {
        TEST_MIN_MAX(short,"-32,768","32,767");
        TEST_MIN_MAX(unsigned short,"0","65,535");
        TEST_NOPAR(as::number,"-1",unsigned short);
        if(short_parsing_fails()) {
            TEST_NOPAR(as::number,"65,535",short);
        }
    }
    if(sizeof(int)==4) {
        TEST_MIN_MAX(int,"-2,147,483,648","2,147,483,647");
        TEST_MIN_MAX(unsigned int,"0","4,294,967,295");
        TEST_NOPAR(as::number,"-1",unsigned int);
        TEST_NOPAR(as::number,"4,294,967,295",int);
    }
    if(sizeof(long)==4) {
        TEST_MIN_MAX(long,"-2,147,483,648","2,147,483,647");
        TEST_MIN_MAX(unsigned long,"0","4,294,967,295");
        TEST_NOPAR(as::number,"-1",unsigned long);
        TEST_NOPAR(as::number,"4,294,967,295",long);
    }
    if(sizeof(long)==8) {
        TEST_MIN_MAX(long,"-9,223,372,036,854,775,808","9,223,372,036,854,775,807");
        TEST_MIN_MAX_FMT(unsigned long,"0","18446744073709551615"); // Unsupported range by icu - ensure fallback
        TEST_NOPAR(as::number,"-1",unsigned long);
    }
    #ifndef BOOSTER_NO_LONG_LONG
    if(sizeof(long long)==8) {
        TEST_MIN_MAX(long long,"-9,223,372,036,854,775,808","9,223,372,036,854,775,807");
        // we can't really parse this as ICU does not support this range, only format
        TEST_MIN_MAX_FMT(unsigned long long,"0","18446744073709551615"); // Unsupported range by icu - ensure fallback
        TEST_FMT(as::number,9223372036854775807ULL,"9,223,372,036,854,775,807");
        TEST_FMT(as::number,9223372036854775808ULL,"9223372036854775808"); // Unsupported range by icu - ensure fallback
        TEST_NOPAR(as::number,"-1",unsigned long long);
    }
    #endif



    TEST_FP3(as::number,std::left,std::setw(3),15,"15 ",int,15);
    TEST_FP3(as::number,std::right,std::setw(3),15," 15",int,15);
    TEST_FP3(as::number,std::setprecision(3),std::fixed,13.1,"13.100",double,13.1);
    #if BOOSTER_ICU_VER < 5601 
    // bug #13276
    TEST_FP3(as::number,std::setprecision(3),std::scientific,13.1,"1.310E1",double,13.1);
    #endif

    TEST_NOPAR(as::number,"",int);
    TEST_NOPAR(as::number,"--3",int);
    TEST_NOPAR(as::number,"y",int);

    TEST_FP1(as::percent,0.1,"10%",double,0.1);
    TEST_FP3(as::percent,std::fixed,std::setprecision(1),0.10,"10.0%",double,0.1);

    TEST_NOPAR(as::percent,"1",double);

    TEST_FP1(as::currency,1345,"$1,345.00",int,1345);
    TEST_FP1(as::currency,1345.34,"$1,345.34",double,1345.34);

    TEST_NOPAR(as::currency,"$",double);


    #if BOOSTER_ICU_VER >= 402
    TEST_FP2(as::currency,as::currency_national,1345,"$1,345.00",int,1345);
    TEST_FP2(as::currency,as::currency_national,1345.34,"$1,345.34",double,1345.34);
    TEST_FP2(as::currency,as::currency_iso,1345,"USD1,345.00",int,1345);
    TEST_FP2(as::currency,as::currency_iso,1345.34,"USD1,345.34",double,1345.34);
    #endif
    TEST_FP1(as::spellout,10,"ten",int,10);
    #if 402 <= BOOSTER_ICU_VER && BOOSTER_ICU_VER < 408
    if(e_charset=="UTF-8") {
        TEST_FMT(as::ordinal,1,"1\xcb\xa2\xe1\xb5\x97"); // 1st with st as ligatures
    }
    #else
        TEST_FMT(as::ordinal,1,"1st");
    #endif

    time_t a_date = 3600*24*(31+4); // Feb 5th
    time_t a_time = 3600*15+60*33; // 15:33:05
    time_t a_timesec = 13;
    time_t a_datetime = a_date + a_time + a_timesec;

    TEST_FP2(as::date,                as::gmt,a_datetime,"Feb 5, 1970",time_t,a_date);
    TEST_FP3(as::date,as::date_short ,as::gmt,a_datetime,"2/5/70",time_t,a_date);
    TEST_FP3(as::date,as::date_medium,as::gmt,a_datetime,"Feb 5, 1970",time_t,a_date);
    TEST_FP3(as::date,as::date_long  ,as::gmt,a_datetime,"February 5, 1970",time_t,a_date);
    TEST_FP3(as::date,as::date_full  ,as::gmt,a_datetime,"Thursday, February 5, 1970",time_t,a_date);
    
    TEST_NOPAR(as::date>>as::date_short,"aa/bb/cc",double);

#if BOOSTER_ICU_VER >= 5901
#define GMT_FULL "Greenwich Mean Time"
#else
#define GMT_FULL "GMT"
#endif
    
    TEST_FP2(as::time,                as::gmt,a_datetime,"3:33:13 PM",time_t,a_time+a_timesec);
    TEST_FP3(as::time,as::time_short ,as::gmt,a_datetime,"3:33 PM",time_t,a_time);
    TEST_FP3(as::time,as::time_medium,as::gmt,a_datetime,"3:33:13 PM",time_t,a_time+a_timesec);
    #if BOOSTER_ICU_VER >= 408
    TEST_FP3(as::time,as::time_long  ,as::gmt,a_datetime,"3:33:13 PM GMT",time_t,a_time+a_timesec);
        #if BOOSTER_ICU_EXACT_VER != 40800
            // know bug #8675
            TEST_FP3(as::time,as::time_full  ,as::gmt,a_datetime,"3:33:13 PM " GMT_FULL,time_t,a_time+a_timesec);
        #endif
    #else
    TEST_FP3(as::time,as::time_long  ,as::gmt,a_datetime,"3:33:13 PM GMT+00:00",time_t,a_time+a_timesec);
    TEST_FP3(as::time,as::time_full  ,as::gmt,a_datetime,"3:33:13 PM GMT+00:00",time_t,a_time+a_timesec);
    #endif
    
    TEST_NOPAR(as::time,"AM",double);

    TEST_FP2(as::time,                as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM",time_t,a_time+a_timesec);
    TEST_FP3(as::time,as::time_short ,as::time_zone("GMT+01:00"),a_datetime,"4:33 PM",time_t,a_time);
    TEST_FP3(as::time,as::time_medium,as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM",time_t,a_time+a_timesec);

#if U_ICU_VERSION_MAJOR_NUM >= 52
#define GMT_P100 "GMT+1"
#else
#define GMT_P100 "GMT+01:00"
#endif


#if U_ICU_VERSION_MAJOR_NUM >= 50
#define PERIOD "," 
#define ICUAT " at"
#else
#define PERIOD ""
#define ICUAT ""
#endif

    TEST_FP3(as::time,as::time_long  ,as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM "  GMT_P100,time_t,a_time+a_timesec);
    #if BOOSTER_ICU_VER == 308 && defined(__CYGWIN__)
    // Known faliture ICU issue
    #else
    TEST_FP3(as::time,as::time_full  ,as::time_zone("GMT+01:00"),a_datetime,"4:33:13 PM GMT+01:00",time_t,a_time+a_timesec);
    #endif

    TEST_FP2(as::datetime,                                as::gmt,a_datetime,"Feb 5, 1970" PERIOD  " 3:33:13 PM",time_t,a_datetime);
    TEST_FP4(as::datetime,as::date_short ,as::time_short ,as::gmt,a_datetime,"2/5/70" PERIOD " 3:33 PM",time_t,a_date+a_time);
    TEST_FP4(as::datetime,as::date_medium,as::time_medium,as::gmt,a_datetime,"Feb 5, 1970" PERIOD " 3:33:13 PM",time_t,a_datetime);
    #if BOOSTER_ICU_VER >= 408
    TEST_FP4(as::datetime,as::date_long  ,as::time_long  ,as::gmt,a_datetime,"February 5, 1970" ICUAT " 3:33:13 PM GMT",time_t,a_datetime);
        #if BOOSTER_ICU_EXACT_VER != 40800
            // know bug #8675
            TEST_FP4(as::datetime,as::date_full  ,as::time_full  ,as::gmt,a_datetime,"Thursday, February 5, 1970" ICUAT " 3:33:13 PM " GMT_FULL,time_t,a_datetime);
        #endif
    #else
    TEST_FP4(as::datetime,as::date_long  ,as::time_long  ,as::gmt,a_datetime,"February 5, 1970" PERIOD " 3:33:13 PM GMT+00:00",time_t,a_datetime);
    TEST_FP4(as::datetime,as::date_full  ,as::time_full  ,as::gmt,a_datetime,"Thursday, February 5, 1970" PERIOD " 3:33:13 PM GMT+00:00",time_t,a_datetime);
    #endif

    time_t now=time(0);
    time_t lnow = now + 3600 * 4;
    char local_time_str[256];
    std::string format="%H:%M:%S";
    std::basic_string<CharType> format_string(format.begin(),format.end());
    strftime(local_time_str,sizeof(local_time_str),format.c_str(),gmtime(&lnow));
    TEST_FMT(as::ftime(format_string),now,local_time_str);
    TEST_FMT(as::ftime(format_string)<<as::gmt<<as::local_time,now,local_time_str);

    std::string marks =  
        "aAbB" 
        "cdeh"
        "HIjm"
        "Mnpr"
        "RStT"
        "xXyY"
        "Z%";

    std::string result[]= { 
        "Thu","Thursday","Feb","February",  // aAbB
        #if BOOSTER_ICU_VER >= 408
        "Thursday, February 5, 1970" ICUAT  " 3:33:13 PM " GMT_FULL, // c
        #else
        "Thursday, February 5, 1970 3:33:13 PM GMT+00:00", // c
        #endif
        "05","5","Feb", // deh
        "15","03","36","02", // HIjm
        "33","\n","PM", "03:33:13 PM",// Mnpr
        "15:33","13","\t","15:33:13", // RStT
        "Feb 5, 1970","3:33:13 PM","70","1970", // xXyY
        #if BOOSTER_ICU_VER >= 408
        GMT_FULL // Z
        #else
        "GMT+00:00" // Z
        #endif
        ,"%" }; // %

    for(unsigned i=0;i<marks.size();i++) {
        format_string.clear();
        format_string+=static_cast<CharType>('%');
        format_string+=static_cast<CharType>(marks[i]);
        TEST_FMT(as::ftime(format_string)<<as::gmt,a_datetime,result[i]);
    }

    std::string sample_f[]={
        "Now is %A, %H o'clo''ck ' or not ' ",
        "'test %H'",
        "%H'",
        "'%H'" 
    };
    std::string expected_f[] = {
        "Now is Thursday, 15 o'clo''ck ' or not ' ",
        "'test 15'",
        "15'",
        "'15'"
    };

    for(unsigned i=0;i<sizeof(sample_f)/sizeof(sample_f[0]);i++) {
        format_string.assign(sample_f[i].begin(),sample_f[i].end());
        TEST_FMT(as::ftime(format_string)<<as::gmt,a_datetime,expected_f[i]);
    }

}